

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprMightBeIndexed(SrcList *pFrom,int *aiCurCol,Expr *pExpr,int op)

{
  int in_ECX;
  int *in_RDX;
  SrcList *in_RSI;
  int *in_RDI;
  Index *pIdx;
  int i;
  long lVar1;
  int iVar2;
  int local_4;
  
  if ((((char)*in_RDX == -0x4f) && (0x36 < in_ECX)) && (in_ECX < 0x3b)) {
    in_RDX = *(int **)(*(long *)(in_RDX + 8) + 8);
  }
  if ((char)*in_RDX == -0x58) {
    in_RSI->nSrc = in_RDX[0xb];
    in_RSI->nAlloc = (int)(short)in_RDX[0xc];
    local_4 = 1;
  }
  else {
    for (iVar2 = 0; iVar2 < *in_RDI; iVar2 = iVar2 + 1) {
      for (lVar1 = *(long *)(*(long *)(in_RDI + (long)iVar2 * 0x12 + 6) + 0x10); lVar1 != 0;
          lVar1 = *(long *)(lVar1 + 0x28)) {
        if (*(long *)(lVar1 + 0x50) != 0) {
          iVar2 = exprMightBeIndexed2(in_RSI,in_RDX,(Expr *)CONCAT44(in_ECX,iVar2),
                                      (int)((ulong)lVar1 >> 0x20));
          return iVar2;
        }
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int exprMightBeIndexed(
  SrcList *pFrom,        /* The FROM clause */
  int *aiCurCol,         /* Write the referenced table cursor & column here */
  Expr *pExpr,           /* An operand of a comparison operator */
  int op                 /* The specific comparison operator */
){
  int i;

  /* If this expression is a vector to the left or right of a
  ** inequality constraint (>, <, >= or <=), perform the processing
  ** on the first element of the vector.  */
  assert( TK_GT+1==TK_LE && TK_GT+2==TK_LT && TK_GT+3==TK_GE );
  assert( TK_IS<TK_GE && TK_ISNULL<TK_GE && TK_IN<TK_GE );
  assert( op<=TK_GE );
  if( pExpr->op==TK_VECTOR && (op>=TK_GT && ALWAYS(op<=TK_GE)) ){
    assert( ExprUseXList(pExpr) );
    pExpr = pExpr->x.pList->a[0].pExpr;
  }

  if( pExpr->op==TK_COLUMN ){
    aiCurCol[0] = pExpr->iTable;
    aiCurCol[1] = pExpr->iColumn;
    return 1;
  }

  for(i=0; i<pFrom->nSrc; i++){
    Index *pIdx;
    for(pIdx=pFrom->a[i].pSTab->pIndex; pIdx; pIdx=pIdx->pNext){
      if( pIdx->aColExpr ){
        return exprMightBeIndexed2(pFrom,aiCurCol,pExpr,i);
      }
    }
  }
  return 0;
}